

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IniTest.cpp
# Opt level: O0

void __thiscall TApp_IniOutputSet_Test::~TApp_IniOutputSet_Test(TApp_IniOutputSet_Test *this)

{
  TApp_IniOutputSet_Test *this_local;
  
  ~TApp_IniOutputSet_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(TApp, IniOutputSet) {

    int v;
    app.add_set("--simple", v, {1, 2, 3});

    args = {"--simple=2"};

    run();

    std::string str = app.config_to_str();
    EXPECT_THAT(str, HasSubstr("simple=2"));
}